

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O2

void __thiscall PingClient::PingClient(PingClient *this,string *remoteTarget,string *msg)

{
  long lVar1;
  long *plVar2;
  char c;
  string local_40 [32];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__Hub_00104cc0;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"udp:port=8766",(allocator<char> *)&c)
  ;
  lVar1 = Dashel::Hub::connect((string *)this);
  if (lVar1 == 0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(lVar1,&Dashel::Stream::typeinfo,&Dashel::PacketStream::typeinfo,
                                    0xffffffffffffffff);
  }
  std::__cxx11::string::~string(local_40);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*(long *)((long)plVar2 + *(long *)(*plVar2 + -0x18)) + 0x10))
              ((long)plVar2 + *(long *)(*plVar2 + -0x18),(msg->_M_dataplus)._M_p,
               msg->_M_string_length);
    c = '\0';
    (**(code **)(*(long *)((long)plVar2 + *(long *)(*plVar2 + -0x18)) + 0x10))
              ((long)plVar2 + *(long *)(*plVar2 + -0x18),&c,1);
    Dashel::IPV4Address::IPV4Address((IPV4Address *)local_40,(string *)remoteTarget,0x223d);
    (**(code **)*plVar2)(plVar2,local_40);
    return;
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x3a,"PingClient::PingClient(const string &, const string &)");
}

Assistant:

PingClient(const string& remoteTarget, const string& msg)
	{
		PacketStream* packetStream = dynamic_cast<PacketStream*>(connect("udp:port=8766"));
		assert(packetStream);

		packetStream->write(msg.c_str(), msg.length());
		char c = 0;
		packetStream->write(&c, 1);

		packetStream->send(IPV4Address(remoteTarget, 8765));
	}